

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void GdlRuleItem::GenerateInsertEqualsFalse
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput)

{
  value_type_conflict3 *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff4;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar3 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(1,CONCAT16(in_stack_fffffffffffffff6,
                                 CONCAT15(in_stack_fffffffffffffff5,
                                          CONCAT14(in_stack_fffffffffffffff4,
                                                   in_stack_fffffffffffffff0)))),
             in_stack_ffffffffffffffe8);
  uVar2 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(uVar3,(uint7)CONCAT15(in_stack_fffffffffffffff5,
                                            CONCAT14(in_stack_fffffffffffffff4,
                                                     in_stack_fffffffffffffff0))),
             in_stack_ffffffffffffffe8);
  uVar1 = 0x23;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(0x23,CONCAT14(in_stack_fffffffffffffff4,
                                                                  in_stack_fffffffffffffff0)))),
             in_stack_ffffffffffffffe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,CONCAT14(0x11,in_stack_fffffffffffffff0)))
                     ),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void GdlRuleItem::GenerateInsertEqualsFalse(std::vector<gr::byte> & vbOutput)
{
	vbOutput.push_back(kopPushByte);
	vbOutput.push_back(0);	// false;
	vbOutput.push_back(kopAttrSet);
	vbOutput.push_back(kslatInsert);
}